

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

Bool IsValidColorCode(ctmbstr color)

{
  uint uVar1;
  Bool BVar2;
  char *pcVar3;
  uint local_1c;
  uint i;
  ctmbstr color_local;
  
  uVar1 = prvTidytmbstrlen(color);
  if (uVar1 == 6) {
    for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
      BVar2 = prvTidyIsDigit((int)color[local_1c]);
      if (BVar2 == no) {
        uVar1 = prvTidyToLower((int)color[local_1c]);
        pcVar3 = strchr("abcdef",uVar1);
        if (pcVar3 == (char *)0x0) {
          return no;
        }
      }
    }
    color_local._4_4_ = yes;
  }
  else {
    color_local._4_4_ = no;
  }
  return color_local._4_4_;
}

Assistant:

static Bool IsValidColorCode(ctmbstr color)
{
    uint i;

    if (TY_(tmbstrlen)(color) != 6)
        return no;

    /* check if valid hex digits and letters */
    for (i = 0; i < 6; i++)
        if (!TY_(IsDigit)(color[i]) && !strchr("abcdef", TY_(ToLower)(color[i])))
            return no;

    return yes;
}